

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

String * doctest::detail::
         stringifyBinaryExpr<std::tuple<std::tuple<int,int>,std::tuple<int,int>>,std::tuple<std::tuple<int,int>,std::tuple<int,int>>>
                   (tuple<std::tuple<int,_int>,_std::tuple<int,_int>_> *lhs,char *op,
                   tuple<std::tuple<int,_int>,_std::tuple<int,_int>_> *rhs)

{
  String *in_RDI;
  tuple<std::tuple<int,_int>,_std::tuple<int,_int>_> *in_stack_ffffffffffffff58;
  String *in_stack_ffffffffffffff70;
  String *in_stack_ffffffffffffffa0;
  String *in_stack_ffffffffffffffa8;
  
  toString<std::tuple<std::tuple<int,_int>,_std::tuple<int,_int>_>,_true>(in_stack_ffffffffffffff58)
  ;
  String::String(in_stack_ffffffffffffff70,(char *)in_RDI);
  String::operator+(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  toString<std::tuple<std::tuple<int,_int>,_std::tuple<int,_int>_>,_true>(in_stack_ffffffffffffff58)
  ;
  String::operator+(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  String::~String(in_stack_ffffffffffffff70);
  String::~String(in_stack_ffffffffffffff70);
  String::~String(in_stack_ffffffffffffff70);
  String::~String(in_stack_ffffffffffffff70);
  return in_RDI;
}

Assistant:

String stringifyBinaryExpr(const DOCTEST_REF_WRAP(L) lhs, const char* op,
                               const DOCTEST_REF_WRAP(R) rhs) {
        // NOLINTNEXTLINE(clang-analyzer-cplusplus.NewDeleteLeaks)
        return toString(lhs) + op + toString(rhs);
    }